

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

void hash_table_rehash(HashTable *ht,int new_size_index)

{
  HashEntry *ptr;
  HashEntry *pHVar1;
  uint32_t uVar2;
  HashEntry *pHVar3;
  long lVar4;
  ulong uVar5;
  HashEntry *pHVar6;
  
  if (0x1e < new_size_index) {
    return;
  }
  pHVar3 = (HashEntry *)raviX_calloc((ulong)hash_sizes[new_size_index].size,0x18);
  ptr = ht->table;
  uVar5 = (ulong)ht->size;
  ht->table = pHVar3;
  ht->size_index = new_size_index;
  uVar2 = hash_sizes[(uint)new_size_index].rehash;
  ht->size = hash_sizes[(uint)new_size_index].size;
  ht->rehash = uVar2;
  ht->max_entries = hash_sizes[(uint)new_size_index].max_entries;
  ht->entries = 0;
  ht->deleted_entries = 0;
  if (uVar5 != 0) {
    lVar4 = uVar5 * 0x18;
    pHVar3 = ptr;
    do {
      if ((uint32_t *)pHVar3->key != (uint32_t *)0x0 &&
          (uint32_t *)pHVar3->key != &deleted_key_value) goto LAB_0010d5eb;
      pHVar3 = pHVar3 + 1;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  pHVar3 = (HashEntry *)0x0;
LAB_0010d5eb:
  if (pHVar3 != (HashEntry *)0x0) {
    do {
      raviX_hash_table_insert_pre_hashed(ht,pHVar3->hash,pHVar3->key,pHVar3->data);
      pHVar6 = pHVar3;
      do {
        pHVar3 = pHVar6 + 1;
        if (pHVar3 == ptr + uVar5) {
          pHVar3 = (HashEntry *)0x0;
          break;
        }
        pHVar1 = pHVar6 + 1;
        pHVar6 = pHVar3;
      } while ((uint32_t *)pHVar1->key == (uint32_t *)0x0 ||
               (uint32_t *)pHVar1->key == &deleted_key_value);
    } while (pHVar3 != (HashEntry *)0x0);
  }
  raviX_free(ptr);
  return;
}

Assistant:

static void
hash_table_rehash(HashTable *ht, int new_size_index)
{
	HashTable old_ht;
	HashEntry *table, *entry;

	if (new_size_index >= ARRAY_SIZE(hash_sizes))
		return;

	table = (HashEntry *) raviX_calloc(hash_sizes[new_size_index].size, sizeof(*ht->table));

	old_ht = *ht;

	ht->table = table;
	ht->size_index = new_size_index;
	ht->size = hash_sizes[ht->size_index].size;
	ht->rehash = hash_sizes[ht->size_index].rehash;
	ht->max_entries = hash_sizes[ht->size_index].max_entries;
	ht->entries = 0;
	ht->deleted_entries = 0;

	hash_table_foreach(&old_ht, entry) {
		raviX_hash_table_insert_pre_hashed(ht, entry->hash,
					     entry->key, entry->data);
	}

	raviX_free(old_ht.table);
}